

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutApi.c
# Opt level: O2

Cut_Cut_t * Cut_NodeReadCutsTemp(Cut_Man_t *p,int Node)

{
  Vec_Ptr_t *pVVar1;
  
  pVVar1 = p->vCutsTemp;
  if (pVVar1->nSize <= Node) {
    __assert_fail("Node < p->vCutsTemp->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cut/cutApi.c"
                  ,0x52,"Cut_Cut_t *Cut_NodeReadCutsTemp(Cut_Man_t *, int)");
  }
  if ((-1 < Node) && (Node < pVVar1->nSize)) {
    return (Cut_Cut_t *)pVVar1->pArray[(uint)Node];
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Cut_Cut_t * Cut_NodeReadCutsTemp( Cut_Man_t * p, int Node )
{
    assert( Node < p->vCutsTemp->nSize );
    return (Cut_Cut_t *)Vec_PtrEntry( p->vCutsTemp, Node );
}